

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O1

string * __thiscall
JointActionDiscrete::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,JointActionDiscrete *this)

{
  pointer ppAVar1;
  string *psVar2;
  pointer ppAVar3;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppAVar3 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar1) {
    do {
      if (*ppAVar3 != (ActionDiscrete *)0x0) {
        (*((*ppAVar3)->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity[3])
                  (&local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1e0,local_1d8);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
      }
      if (ppAVar3 != ppAVar1 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_",1);
      }
      ppAVar3 = ppAVar3 + 1;
    } while (ppAVar3 != ppAVar1);
  }
  psVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

string JointActionDiscrete::SoftPrintBrief() const
{
    stringstream ss;
    vector<const ActionDiscrete*>::const_iterator it =  _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last =  _m_apVector.end();
    
    while(it != last)
    {
        if(*it != 0)
            ss << (*it)->SoftPrintBrief();
        if(it != last-1)
            ss << "_";
        it++;
    }
    return(ss.str());
}